

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O0

entry * __thiscall
cppcms::url_mapper::data::get_entry
          (data *this,string_key *key,size_t params_no,string_key *full_url)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *error;
  pointer ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  const_iterator sp;
  const_iterator kp;
  string *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  string_key *in_stack_fffffffffffffe48;
  _Self local_118;
  _Self local_110;
  undefined1 local_101;
  _Self local_30;
  _Self local_28 [5];
  
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
       ::find((map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
               *)in_stack_fffffffffffffe08,(key_type *)0x3c0055);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
       ::end((map<cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
              *)in_stack_fffffffffffffe08);
  bVar1 = std::operator==(local_28,&local_30);
  if (bVar1) {
    local_101 = 1;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x30);
    string_key::str_abi_cxx11_(in_stack_fffffffffffffe48);
    std::operator+((char *)in_RDI,__rhs);
    std::operator+(in_RDI,(char *)__rhs);
    string_key::str_abi_cxx11_(in_stack_fffffffffffffe48);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::operator+(in_RDI,(char *)__rhs);
    cppcms_error::cppcms_error((cppcms_error *)__rhs,in_stack_fffffffffffffe08);
    local_101 = 0;
    __cxa_throw(__rhs,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  std::
  _Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>
  ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>
                *)0x3c029f);
  local_110._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
       ::find((map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
               *)in_stack_fffffffffffffe08,(key_type *)0x3c02b3);
  std::
  _Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>
  ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>
                *)0x3c02c8);
  local_118._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
       ::end((map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
              *)in_stack_fffffffffffffe08);
  bVar1 = std::operator==(&local_110,&local_118);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>
                           *)0x3c04dd);
    return &ppVar2->second;
  }
  error = (string *)__cxa_allocate_exception(0x30);
  string_key::str_abi_cxx11_(in_stack_fffffffffffffe48);
  std::operator+((char *)in_RDI,in_stack_fffffffffffffe10);
  std::operator+(in_RDI,(char *)in_stack_fffffffffffffe10);
  string_key::str_abi_cxx11_(in_stack_fffffffffffffe48);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::operator+(in_RDI,(char *)in_stack_fffffffffffffe10);
  cppcms_error::cppcms_error((cppcms_error *)in_stack_fffffffffffffe10,error);
  __cxa_throw(error,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
}

Assistant:

entry const &get_entry(string_key const &key,size_t params_no,string_key const &full_url) const
		{
			by_key_type::const_iterator kp = by_key.find(key);
			if(kp == by_key.end())
				throw cppcms_error("url_mapper: key `" + key.str() + "' not found for "
						"url `" + full_url.str() + "'");
			by_size_type::const_iterator sp = kp->second.find(params_no);
			if(sp == kp->second.end())
				throw cppcms_error("url_mapper: invalid number of parameters for " + key.str() +
						"in url `" + full_url.str() + "'");
			return sp->second;
		}